

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O1

void test_writer(string *name)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  json *this;
  ostream *poVar3;
  pointer *__ptr;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j;
  undefined1 local_38 [8];
  string local_30;
  
  __stream = fopen("test_files/tmp.json","r");
  iVar2 = fseek(__stream,0,2);
  if (iVar2 == 0xd) {
    fclose(__stream);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"test_files/tmp.json","");
    argo::parser::load((parser *)local_38,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    this = argo::json::operator[]((json *)local_38,"one");
    bVar1 = argo::json::operator==(this,1);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&jlog,"PASS: ",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&jlog,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," value of field one is 1",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&jlog,"FAIL: ",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&jlog,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," value of field one is not 1",0x1c)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_38 != (undefined1  [8])0x0) {
      argo::json::~json((json *)local_38);
      operator_delete((void *)local_38);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&jlog,"FAIL: ",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&jlog,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," writer file length is not 13 : ",0x20)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void test_writer(string name)
{
    FILE *f = fopen("test_files/tmp.json", "r");
    if (fseek(f, 0, SEEK_END) != 13)
    {
        jlog << "FAIL: " << name << " writer file length is not 13 : " << endl;
    }
    else
    {
        fclose(f);
        auto j = parser::load("test_files/tmp.json");
        if ((*j)["one"] == 1)
        {
            jlog << "PASS: " << name << " value of field one is 1" << endl;
        }
        else
        {
            jlog << "FAIL: " << name << " value of field one is not 1" << endl;
        }
    }
}